

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseColGroup(TidyDocImpl *doc,Node *colgroup,GetTokenMode mode)

{
  Bool BVar1;
  Node *node_00;
  Node *local_30;
  Node *parent;
  Node *node;
  GetTokenMode mode_local;
  Node *colgroup_local;
  TidyDocImpl *doc_local;
  
  if ((colgroup->tag->model & 1) == 0) {
    while (node_00 = prvTidyGetToken(doc,IgnoreWhitespace), node_00 != (Node *)0x0) {
      if ((node_00->tag == colgroup->tag) && (node_00->type == EndTag)) {
        prvTidyFreeNode(doc,node_00);
        colgroup->closed = yes;
        return;
      }
      if (node_00->type == EndTag) {
        if (((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
           (node_00->tag->id != TidyTag_FORM)) {
          for (local_30 = colgroup->parent; local_30 != (Node *)0x0; local_30 = local_30->parent) {
            if (node_00->tag == local_30->tag) {
              prvTidyUngetToken(doc);
              return;
            }
          }
          goto LAB_00149ea2;
        }
        BadForm(doc);
        prvTidyReport(doc,colgroup,node_00,0x235);
        prvTidyFreeNode(doc,node_00);
      }
      else {
LAB_00149ea2:
        BVar1 = prvTidynodeIsText(node_00);
        if (BVar1 != no) {
          prvTidyUngetToken(doc);
          return;
        }
        BVar1 = InsertMisc(colgroup,node_00);
        if (BVar1 == no) {
          if (node_00->tag == (Dict *)0x0) {
            prvTidyReport(doc,colgroup,node_00,0x235);
            prvTidyFreeNode(doc,node_00);
          }
          else {
            if (((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
               (node_00->tag->id != TidyTag_COL)) {
              prvTidyUngetToken(doc);
              return;
            }
            if (node_00->type == EndTag) {
              prvTidyReport(doc,colgroup,node_00,0x235);
              prvTidyFreeNode(doc,node_00);
            }
            else {
              prvTidyInsertNodeAtEnd(colgroup,node_00);
              ParseTag(doc,node_00,IgnoreWhitespace);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TY_(ParseColGroup)(TidyDocImpl* doc, Node *colgroup, GetTokenMode ARG_UNUSED(mode))
{
    Node *node, *parent;

    if (colgroup->tag->model & CM_EMPTY)
        return;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == colgroup->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            colgroup->closed = yes;
            return;
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = colgroup->parent;
                  parent != NULL;
                  parent = parent->parent )
            {
                if (node->tag == parent->tag)
                {
                    TY_(UngetToken)( doc );
                    return;
                }
            }
        }

        if (TY_(nodeIsText)(node))
        {
            TY_(UngetToken)( doc );
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(colgroup, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsCOL(node) )
        {
            TY_(UngetToken)( doc );
            return;
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /* node should be <COL> */
        TY_(InsertNodeAtEnd)(colgroup, node);
        ParseTag(doc, node, IgnoreWhitespace);
    }
}